

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::buyCards(Player *this)

{
  Stronghold *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Type TVar5;
  ostream *poVar6;
  BlackCard *pBVar7;
  list<BlackCard_*,_std::allocator<BlackCard_*>_> *this_01;
  reference ppBVar8;
  string *psVar9;
  _List_const_iterator<BlackCard_*> local_90;
  list<Card_*,_std::allocator<Card_*>_> local_88;
  string local_70 [32];
  BlackCard *local_50;
  BlackCard *bought;
  char local_31;
  string local_30 [7];
  char ans;
  string buy;
  Player *this_local;
  
  std::__cxx11::string::string(local_30);
  poVar6 = std::operator<<((ostream *)&std::cout,"Do you want to buy a card?");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(poVar6,"Enter y for yes, n for no");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,&local_31);
  while (local_31 == 'y') {
    poVar6 = std::operator<<((ostream *)&std::cout,"Enter name of province to buy");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::operator>>((istream *)&std::cin,local_30);
    std::__cxx11::string::string(local_70,local_30);
    pBVar7 = DynastyDeck::searchDeck(&this->provinces,(string *)local_70);
    std::__cxx11::string::~string(local_70);
    local_50 = pBVar7;
    if (pBVar7 == (BlackCard *)0x0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Invalid province");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      bVar1 = BlackCard::isRevealed(pBVar7);
      if (bVar1) {
        iVar2 = Stronghold::getMoney(this->stronghold);
        iVar3 = (*(local_50->super_Card)._vptr_Card[4])();
        if (iVar2 < iVar3) {
          poVar6 = std::operator<<((ostream *)&std::cout,"Not enough money");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
        else {
          iVar2 = this->honour;
          iVar3 = (*(local_50->super_Card)._vptr_Card[6])();
          pBVar7 = local_50;
          if (iVar2 < iVar3) {
            poVar6 = std::operator<<((ostream *)&std::cout,"Not enough honour");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          }
          else {
            this_00 = this->stronghold;
            uVar4 = Stronghold::getMoney(this_00);
            iVar2 = (**(pBVar7->super_Card)._vptr_Card)
                              (pBVar7,(ulong)uVar4,(ulong)(uint)this->honour);
            Stronghold::setMoney(this_00,iVar2);
            TVar5 = Card::getType(&local_50->super_Card);
            if (TVar5 == HOLDING) {
              DynastyDeck::pushCard(&this->holdings,local_50);
              pBVar7 = local_50;
              Deck::getDeck_abi_cxx11_(&local_88,&(this->holdings).super_Deck);
              (*(pBVar7->super_Card)._vptr_Card[5])(pBVar7,&local_88,local_50);
              std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::~list(&local_88);
            }
            else {
              DynastyDeck::pushCard(&this->army,local_50);
            }
            this_01 = DynastyDeck::getDynDeck_abi_cxx11_(&this->dynDeck);
            local_90._M_node =
                 (_List_node_base *)
                 std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::begin(this_01);
            ppBVar8 = std::_List_const_iterator<BlackCard_*>::operator*(&local_90);
            pBVar7 = DynastyDeck::popCard(&this->dynDeck,*ppBVar8);
            DynastyDeck::pushCard(&this->provinces,pBVar7);
            poVar6 = std::operator<<((ostream *)&std::cout,"Bought card ");
            psVar9 = BlackCard::getName_abi_cxx11_(local_50);
            poVar6 = std::operator<<(poVar6,(string *)psVar9);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          }
        }
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cout,"Invalid province");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
    }
    if (local_50 != (BlackCard *)0x0) {
      (*(local_50->super_Card)._vptr_Card[3])();
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"Do you want to buy more cards?");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,"Enter y for yes, n for no");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
    std::operator>>((istream *)&std::cin,&local_31);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Player::buyCards()                                     //player can buy holdings or personalities from his provinces if he wants to
{
    string buy;
    char ans;

    cout << "Do you want to buy a card?"<<endl<<"Enter y for yes, n for no"<<endl;
    cin >> ans;

    //buys selected province if enough money and honour and replaces it with an unrevealed card from dynDeck
    while (ans == 'y')
    {
        cout << "Enter name of province to buy" << endl;
        cin >> buy;

        BlackCard *bought = provinces.searchDeck(buy);           //searches from province with name = buy
        if (bought)
        {
            if (!bought->isRevealed())
                cout <<"Invalid province"<<endl;
            else if (stronghold->getMoney() < bought->getCost())
                cout << "Not enough money" << endl;
            else if (honour < bought->getHonour())
                cout << "Not enough honour" << endl;
            else
            {
                stronghold->setMoney(bought->effectBonus(stronghold->getMoney(), honour));      //pay

                //add it to player's holdings or army
                if (bought->getType() == Card::HOLDING)
                {
                    holdings.pushCard(bought);
                    bought->ChainHoldings(holdings.getDeck(), reinterpret_cast<Holding *>(bought));    //check for chains
                }
                else
                    army.pushCard(bought);

                //replace it with new unrevealed province from dynDeck
                provinces.pushCard(dynDeck.popCard(*dynDeck.getDynDeck().begin()));
                cout << "Bought card " << bought->getName() << endl;
            }
        }
        else
            cout << "Invalid province"<<endl;

        delete bought;

        cout << "Do you want to buy more cards?"<<endl<<"Enter y for yes, n for no"<<endl;
        cin.clear();
        cin >> ans;
    }
    cout<<endl;
}